

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

void __thiscall
kj::_::ForkHubBase::ForkHubBase
          (ForkHubBase *this,OwnPromiseNode *innerParam,ExceptionOrValue *resultRef,
          SourceLocation location)

{
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *other;
  PromiseNode *pPVar1;
  ExceptionOrValue *resultRef_local;
  OwnPromiseNode *innerParam_local;
  ForkHubBase *this_local;
  
  PromiseArenaMember::PromiseArenaMember(&this->super_PromiseArenaMember);
  Event::Event(&this->super_Event,location);
  (this->super_PromiseArenaMember)._vptr_PromiseArenaMember =
       (_func_int **)&PTR___cxa_pure_virtual_00c0d898;
  (this->super_Event)._vptr_Event = (_func_int **)&DAT_00c0d8c0;
  this->refcount = 1;
  other = mv<kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>>(innerParam);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::Own(&this->inner,other);
  this->resultRef = resultRef;
  this->headBranch = (ForkBranchBase *)0x0;
  this->tailBranch = &this->headBranch;
  pPVar1 = Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::operator->(&this->inner);
  (*(pPVar1->super_PromiseArenaMember)._vptr_PromiseArenaMember[2])();
  pPVar1 = Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::operator->(&this->inner);
  (*(pPVar1->super_PromiseArenaMember)._vptr_PromiseArenaMember[1])(pPVar1,&this->super_Event);
  return;
}

Assistant:

ForkHubBase::ForkHubBase(OwnPromiseNode&& innerParam, ExceptionOrValue& resultRef,
                         SourceLocation location)
    : Event(location), inner(kj::mv(innerParam)), resultRef(resultRef) {
  inner->setSelfPointer(&inner);
  inner->onReady(this);
}